

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLCryptoFactory.cpp
# Opt level: O3

AsymmetricAlgorithm * __thiscall
OSSLCryptoFactory::getAsymmetricAlgorithm(OSSLCryptoFactory *this,Type algorithm)

{
  OSSLRSA *this_00;
  AsymmetricAlgorithm *this_01;
  undefined *puVar1;
  OSSLDSA *this_02;
  
  switch(algorithm) {
  case RSA:
    this_00 = (OSSLRSA *)operator_new(0x40);
    OSSLRSA::OSSLRSA(this_00);
    return &this_00->super_AsymmetricAlgorithm;
  case DSA:
    this_02 = (OSSLDSA *)operator_new(0x30);
    OSSLDSA::OSSLDSA(this_02);
    return &this_02->super_AsymmetricAlgorithm;
  case DH:
    this_01 = (AsymmetricAlgorithm *)operator_new(0x28);
    this_01->_vptr_AsymmetricAlgorithm = (_func_int **)0x0;
    this_01->currentPublicKey = (PublicKey *)0x0;
    this_01->currentPrivateKey = (PrivateKey *)0x0;
    this_01->currentMechanism = Unknown;
    this_01->currentPadding = Unknown;
    *(undefined8 *)&this_01->currentOperation = 0;
    AsymmetricAlgorithm::AsymmetricAlgorithm(this_01);
    puVar1 = &OSSLDH::vtable;
    break;
  case ECDH:
    this_01 = (AsymmetricAlgorithm *)operator_new(0x28);
    this_01->_vptr_AsymmetricAlgorithm = (_func_int **)0x0;
    this_01->currentPublicKey = (PublicKey *)0x0;
    this_01->currentPrivateKey = (PrivateKey *)0x0;
    this_01->currentMechanism = Unknown;
    this_01->currentPadding = Unknown;
    *(undefined8 *)&this_01->currentOperation = 0;
    AsymmetricAlgorithm::AsymmetricAlgorithm(this_01);
    puVar1 = &OSSLECDH::vtable;
    break;
  case ECDSA:
    this_01 = (AsymmetricAlgorithm *)operator_new(0x28);
    this_01->_vptr_AsymmetricAlgorithm = (_func_int **)0x0;
    this_01->currentPublicKey = (PublicKey *)0x0;
    this_01->currentPrivateKey = (PrivateKey *)0x0;
    this_01->currentMechanism = Unknown;
    this_01->currentPadding = Unknown;
    *(undefined8 *)&this_01->currentOperation = 0;
    AsymmetricAlgorithm::AsymmetricAlgorithm(this_01);
    puVar1 = &OSSLECDSA::vtable;
    break;
  default:
    softHSMLog(3,"getAsymmetricAlgorithm",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLCryptoFactory.cpp"
               ,0x164,"Unknown algorithm \'%i\'");
    return (AsymmetricAlgorithm *)0x0;
  case EDDSA:
    this_01 = (AsymmetricAlgorithm *)operator_new(0x28);
    this_01->_vptr_AsymmetricAlgorithm = (_func_int **)0x0;
    this_01->currentPublicKey = (PublicKey *)0x0;
    this_01->currentPrivateKey = (PrivateKey *)0x0;
    this_01->currentMechanism = Unknown;
    this_01->currentPadding = Unknown;
    *(undefined8 *)&this_01->currentOperation = 0;
    AsymmetricAlgorithm::AsymmetricAlgorithm(this_01);
    puVar1 = &OSSLEDDSA::vtable;
  }
  this_01->_vptr_AsymmetricAlgorithm = (_func_int **)(puVar1 + 0x10);
  return this_01;
}

Assistant:

AsymmetricAlgorithm* OSSLCryptoFactory::getAsymmetricAlgorithm(AsymAlgo::Type algorithm)
{
	switch (algorithm)
	{
		case AsymAlgo::RSA:
			return new OSSLRSA();
		case AsymAlgo::DSA:
			return new OSSLDSA();
		case AsymAlgo::DH:
			return new OSSLDH();
#ifdef WITH_ECC
		case AsymAlgo::ECDH:
			return new OSSLECDH();
		case AsymAlgo::ECDSA:
			return new OSSLECDSA();
#endif
#ifdef WITH_GOST
		case AsymAlgo::GOST:
			return new OSSLGOST();
#endif
#ifdef WITH_EDDSA
		case AsymAlgo::EDDSA:
			return new OSSLEDDSA();
#endif
		default:
			break;
	}

	// No algorithm implementation is available
	ERROR_MSG("Unknown algorithm '%i'", algorithm);
	return NULL;
}